

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClip.cpp
# Opt level: O0

void __thiscall PatternClip::save(PatternClip *this,Pattern *src,PatternSelection region)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  TrackRow *pTVar5;
  TrackRow *rowdata;
  char *pcStack_80;
  int row;
  pointer bufAtTrackStart;
  size_t length;
  size_t offset;
  TrackMeta tmeta;
  int track;
  pointer bufAtRowStart;
  long local_40;
  size_t bufsize;
  size_t rowLength;
  Iterator iter;
  Pattern *src_local;
  PatternClip *this_local;
  
  (this->mLocation).mStart.super_PatternCursorBase.row = region.mStart.super_PatternCursorBase.row;
  (this->mLocation).mStart.super_PatternCursorBase.column =
       region.mStart.super_PatternCursorBase.column;
  *(undefined8 *)&(this->mLocation).mStart.super_PatternCursorBase.track = region._8_8_;
  (this->mLocation).mEnd.super_PatternCursorBase.column = region.mEnd.super_PatternCursorBase.column
  ;
  (this->mLocation).mEnd.super_PatternCursorBase.track = region.mEnd.super_PatternCursorBase.track;
  iter.mEnd.super_PatternCursorBase._4_8_ = src;
  PatternSelection::iterator((Iterator *)&rowLength,&this->mLocation);
  sVar3 = PatternClipTU::getRowLength((Iterator *)&rowLength);
  bufsize = sVar3;
  iVar1 = PatternSelection::Iterator::rows((Iterator *)&rowLength);
  local_40 = sVar3 * (long)iVar1;
  std::make_unique<char[]>((size_t)&bufAtRowStart);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
            (&this->mData,(unique_ptr<char[],_std::default_delete<char[]>_> *)&bufAtRowStart);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&bufAtRowStart);
  register0x00000000 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->mData);
  tmeta.mEffectStart = PatternSelection::Iterator::trackStart((Iterator *)&rowLength);
  while( true ) {
    iVar1 = tmeta.mEffectStart;
    iVar2 = PatternSelection::Iterator::trackEnd((Iterator *)&rowLength);
    if (iVar2 < iVar1) break;
    join_0x00000010_0x00000000_ =
         PatternSelection::Iterator::getTrackMeta((Iterator *)&rowLength,tmeta.mEffectStart);
    iVar1 = PatternSelection::TrackMeta::columnStart((TrackMeta *)((long)&offset + 4));
    sVar3 = PatternClipTU::columnToOffset(iVar1);
    iVar1 = PatternSelection::TrackMeta::columnEnd((TrackMeta *)((long)&offset + 4));
    sVar4 = PatternClipTU::columnToLength(iVar1);
    pcStack_80 = stack0xffffffffffffffb0;
    rowdata._4_4_ = PatternSelection::Iterator::rowStart((Iterator *)&rowLength);
    while( true ) {
      iVar1 = PatternSelection::Iterator::rowEnd((Iterator *)&rowLength);
      if (iVar1 < (int)rowdata._4_4_) break;
      pTVar5 = trackerboy::Pattern::getTrackRow
                         ((Pattern *)iter.mEnd.super_PatternCursorBase._4_8_,
                          (ChType)tmeta.mEffectStart,rowdata._4_4_ & 0xffff);
      std::copy_n<char_const*,unsigned_long,char*>
                ((char *)((long)((pTVar5->effects)._M_elems + -1) + sVar3),sVar4 - sVar3,pcStack_80)
      ;
      pcStack_80 = pcStack_80 + bufsize;
      rowdata._4_4_ = rowdata._4_4_ + 1;
    }
    register0x00000000 = stack0xffffffffffffffb0 + (sVar4 - sVar3);
    tmeta.mEffectStart = tmeta.mEffectStart + 1;
  }
  return;
}

Assistant:

void PatternClip::save(trackerboy::Pattern const& src, PatternSelection region) {

    // before we do anything, check that the selection is within the bounds
    // of the given pattern
    #ifndef QT_NO_DEBUG
    {
        auto start = region.start();
        auto end = region.end();

        Q_ASSERT(start.isValid());
        Q_ASSERT(end.isValid());
        Q_ASSERT(start.row < src.size());
        Q_ASSERT(end.row < src.size());
    }
    #endif


    mLocation = region;
    auto const iter = mLocation.iterator();

    // determine the row length
    auto const rowLength = TU::getRowLength(iter);

    auto const bufsize = rowLength * iter.rows();
    Q_ASSERT(bufsize != 0);
    mData = std::make_unique<char[]>(bufsize);

    auto bufAtRowStart = mData.get();
    for (auto track = iter.trackStart(); track <= iter.trackEnd(); ++track) {
        auto const tmeta = iter.getTrackMeta(track);
        auto const offset = TU::columnToOffset(tmeta.columnStart());
        auto const length = TU::columnToLength(tmeta.columnEnd()) - offset;
        // with this assertion passing, we will never read or write past
        // the bounds of a TrackRow
        Q_ASSERT(offset + length <= sizeof(trackerboy::TrackRow));
        Q_ASSERT(length > 0); // if the length is 0 we aren't copying anything, consider this an error

        auto bufAtTrackStart = bufAtRowStart;
        for (int row = iter.rowStart(); row <= iter.rowEnd(); ++row) {
            auto &rowdata = src.getTrackRow(static_cast<trackerboy::ChType>(track), (uint16_t)row);
            std::copy_n(reinterpret_cast<const char*>(&rowdata) + offset, length, bufAtTrackStart);
            // advance to next row
            bufAtTrackStart += rowLength;
        }

        // advance to next track
        bufAtRowStart += length;
    }
}